

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japanese_tests.cpp
# Opt level: O2

int japanese_test::iu_ParamTest_x_iutest_x_iutest_japanese_var63_Test::AddRegister(void)

{
  int iVar1;
  UnitTest *pUVar2;
  ParamTestSuiteInfo<japanese_test::ParamTest> *this;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  if (AddRegister()::testinfo == '\0') {
    iVar1 = __cxa_guard_acquire(&AddRegister()::testinfo);
    if (iVar1 != 0) {
      iutest::detail::
      ParamTestInstance<japanese_test::iu_ParamTest_x_iutest_x_iutest_japanese_var63_Test>::
      ParamTestInstance(&AddRegister::testinfo,anon_var_dwarf_2084c + 0xe);
      __cxa_atexit(iutest::detail::IParamTestInfoData::~IParamTestInfoData,&AddRegister::testinfo,
                   &__dso_handle);
      __cxa_guard_release(&AddRegister()::testinfo);
    }
  }
  pUVar2 = iutest::UnitTest::instance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,anon_var_dwarf_2084c + 0xe,&local_49);
  iutest::detail::package_name_server<japanese_test::iuTest_TestSuitePackage>::getname_abi_cxx11_();
  this = iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<japanese_test::ParamTest>
                   (&pUVar2->m_param_testsuite_holder,&local_28,&local_48);
  iutest::detail::IParamTestSuiteInfo::AddTestPattern
            (&this->super_IParamTestSuiteInfo,&AddRegister::testinfo.super_IParamTestInfoData);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

IUTEST_P(IUTEST_JAPANESE_NAME_F(あいうえお, ParamTest), IUTEST_JAPANESE_NAME(あいうえお))
{
#if IUTEST_HAS_PACKAGE
    IUTEST_ASSERT_STREQ("japanese_test.My1/あいうえお", ::iuutil::GetCurrentTestSuite()->name());
#else
    IUTEST_ASSERT_STREQ("My1/あいうえお", ::iuutil::GetCurrentTestSuite()->name());
#endif
    IUTEST_ASSERT_STREQ("あいうえお/0", ::iutest::UnitTest::GetInstance()->current_test_info()->name());
}